

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenelinearindex_p.h
# Opt level: O0

void __thiscall
QGraphicsSceneLinearIndex::addItem(QGraphicsSceneLinearIndex *this,QGraphicsItem *item)

{
  QList<QGraphicsItem_*> *in_RSI;
  parameter_type in_stack_ffffffffffffffe8;
  
  QList<QGraphicsItem_*>::operator<<(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

virtual void addItem(QGraphicsItem *item) override
    { m_items << item; }